

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereSplit(WhereClause *pWC,Expr *pExpr,int op)

{
  while( true ) {
    pWC->op = (u8)op;
    if (pExpr == (Expr *)0x0) {
      return;
    }
    if ((uint)pExpr->op != op) break;
    whereSplit(pWC,pExpr->pLeft,op);
    pExpr = pExpr->pRight;
  }
  whereClauseInsert(pWC,pExpr,'\0');
  return;
}

Assistant:

static void whereSplit(WhereClause *pWC, Expr *pExpr, int op){
  pWC->op = (u8)op;
  if( pExpr==0 ) return;
  if( pExpr->op!=op ){
    whereClauseInsert(pWC, pExpr, 0);
  }else{
    whereSplit(pWC, pExpr->pLeft, op);
    whereSplit(pWC, pExpr->pRight, op);
  }
}